

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O0

XMLElementDecl * __thiscall
xercesc_4_0::SchemaGrammar::getElemDecl
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *param_3,uint scope)

{
  SchemaElementDecl *local_38;
  SchemaElementDecl *decl;
  uint scope_local;
  XMLCh *param_3_local;
  XMLCh *baseName_local;
  uint uriId_local;
  SchemaGrammar *this_local;
  
  local_38 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::getByKey
                       (this->fElemDeclPool,baseName,uriId,scope);
  if (((local_38 == (SchemaElementDecl *)0x0) &&
      (local_38 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                  getByKey(this->fGroupElemDeclPool,baseName,uriId,scope),
      local_38 == (SchemaElementDecl *)0x0)) &&
     (this->fElemNonDeclPool !=
      (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0)) {
    local_38 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
               getByKey(this->fElemNonDeclPool,baseName,uriId,scope);
  }
  return &local_38->super_XMLElementDecl;
}

Assistant:

inline const XMLElementDecl* SchemaGrammar::getElemDecl( const   unsigned int  uriId
                                              , const XMLCh* const    baseName
                                              , const XMLCh* const
                                              , unsigned int          scope )   const
{
    const SchemaElementDecl* decl = fElemDeclPool->getByKey(baseName, uriId, scope);

    if (!decl) {

        decl = fGroupElemDeclPool->getByKey(baseName, uriId, scope);

        if (!decl && fElemNonDeclPool)
            decl = fElemNonDeclPool->getByKey(baseName, uriId, scope);
    }

    return decl;
}